

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O3

void __thiscall
ON_PhysicallyBasedMaterial::SynchronizeLegacyMaterial(ON_PhysicallyBasedMaterial *this)

{
  ON_Material *this_00;
  double dVar1;
  double dVar2;
  ON_Color OVar3;
  anon_union_4_2_6147a14e_for_ON_Color_15 aVar4;
  int r;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Da_03;
  undefined4 extraout_XMM0_Da_04;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  double in_XMM1_Qa;
  double dVar5;
  double dVar6;
  double dVar7;
  undefined1 local_30 [20];
  anon_union_4_2_6147a14e_for_ON_Color_15 local_1c;
  
  this_00 = *(ON_Material **)this->_impl;
  (*this->_vptr_ON_PhysicallyBasedMaterial[0xd])();
  dVar1 = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
  if (0.5 <= (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da) &&
      (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da) != 0.5) {
    ON_Material::SetDiffuse(this_00,ON_Color::Black);
    dVar5 = 1.0;
  }
  else {
    (*this->_vptr_ON_PhysicallyBasedMaterial[5])(this);
    local_30._8_8_ = in_XMM1_Qa;
    OVar3 = ON_4fColor::operator_cast_to_ON_Color((ON_4fColor *)local_30);
    ON_Material::SetDiffuse(this_00,OVar3);
    (*this->_vptr_ON_PhysicallyBasedMaterial[0x15])(this);
    dVar5 = 1.0 - (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00);
  }
  if (this_00->m_bFresnelReflections != dVar1 <= 0.5) {
    this_00->m_bFresnelReflections = dVar1 <= 0.5;
    ON_ModelComponent::IncrementContentVersionNumber(&this_00->super_ON_ModelComponent);
  }
  if (0.0 <= dVar5) {
    if (dVar5 <= 1.0) {
      this_00->m_reflectivity = dVar5;
    }
    else {
      this_00->m_reflectivity = 1.0;
    }
  }
  else {
    this_00->m_reflectivity = 0.0;
  }
  (*this->_vptr_ON_PhysicallyBasedMaterial[0x25])(this);
  dVar6 = 1.0 - (double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01);
  if (0.0 <= dVar6) {
    if (dVar6 <= 1.0) {
      this_00->m_transparency = dVar6;
    }
    else {
      this_00->m_transparency = 1.0;
    }
  }
  else {
    this_00->m_transparency = 0.0;
  }
  ON_Material::SetAmbient(this_00,ON_Color::Black);
  dVar6 = 255.0;
  dVar2 = dVar5 * 255.0;
  if (!NAN(dVar2)) {
    dVar7 = 0.0;
    if ((0.0 <= dVar2) && (dVar7 = dVar6, dVar2 <= 255.0)) {
      dVar7 = (double)(float)dVar2;
    }
    this_00->m_shine = dVar7;
  }
  if (0.5 < dVar1) {
    (*this->_vptr_ON_PhysicallyBasedMaterial[5])(this);
    local_30._8_8_ = dVar6;
    OVar3 = ON_4fColor::operator_cast_to_ON_Color((ON_4fColor *)local_30);
    ON_Material::SetSpecular(this_00,OVar3);
    (*this->_vptr_ON_PhysicallyBasedMaterial[5])(this);
    local_30._8_8_ = dVar6;
    aVar4 = (anon_union_4_2_6147a14e_for_ON_Color_15)
            ON_4fColor::operator_cast_to_ON_Color((ON_4fColor *)local_30);
  }
  else {
    r = (int)(dVar5 * 255.0);
    ON_Color::ON_Color((ON_Color *)&local_1c,r,r,r);
    ON_Material::SetSpecular(this_00,(ON_Color)local_1c);
    aVar4 = ON_Color::White.field_0;
  }
  (this_00->m_reflection).field_0 = aVar4;
  (*this->_vptr_ON_PhysicallyBasedMaterial[0x15])(this);
  this_00->m_reflection_glossiness = (double)CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02);
  (*this->_vptr_ON_PhysicallyBasedMaterial[0x27])(this);
  this_00->m_refraction_glossiness = (double)CONCAT44(extraout_XMM0_Db_03,extraout_XMM0_Da_03);
  (*this->_vptr_ON_PhysicallyBasedMaterial[0x29])(this);
  local_30._8_8_ = dVar6;
  OVar3 = ON_4fColor::operator_cast_to_ON_Color((ON_4fColor *)local_30);
  ON_Material::SetEmission(this_00,OVar3);
  (*this->_vptr_ON_PhysicallyBasedMaterial[0x23])(this);
  this_00->m_index_of_refraction = (double)CONCAT44(extraout_XMM0_Db_04,extraout_XMM0_Da_04);
  return;
}

Assistant:

void ON_PhysicallyBasedMaterial::SynchronizeLegacyMaterial(void)
{
  auto& mat = *Implementation().material;

  const bool bIsMetal = Metallic() > 0.5;

  mat.SetDiffuse(bIsMetal ? ON_Color::Black : (ON_Color)BaseColor());

  const double reflectivity = bIsMetal ? 1.0 : 1.0 - Roughness();

  mat.SetFresnelReflections(!bIsMetal);

  mat.SetReflectivity(reflectivity);
  mat.SetTransparency(1.0 - Opacity());
  mat.SetAmbient(ON_Color::Black);

  //Gloss
  mat.SetShine(ON_Material::MaxShine * reflectivity);

  if (bIsMetal)
  {
    mat.SetSpecular(BaseColor());
    mat.m_reflection = BaseColor();
  }
  else
  {
    const int bf = (int)(255.0 * reflectivity);
    mat.SetSpecular(ON_Color(bf, bf, bf));
    mat.m_reflection = ON_Color::White;
  }

  mat.m_reflection_glossiness = Roughness();
  mat.m_refraction_glossiness = OpacityRoughness();

  mat.SetEmission(Emission());

  mat.m_index_of_refraction = OpacityIOR();

  //No need to do the textures, because the ones that are supported are in the right channels already.
}